

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::PrepareStartJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  _Rb_tree_header *p_Var1;
  ErrorCode EVar2;
  uint64_t uVar3;
  pointer pcVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  uint __val;
  pointer __k;
  _Alloc_hider _Var11;
  undefined7 in_register_00000081;
  uint __len;
  string *this_00;
  _Base_ptr p_Var12;
  string __str;
  Expression expr;
  BorderRouter br;
  Config conf;
  undefined1 local_380 [8];
  _Alloc_hider local_378;
  undefined1 local_370 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  string *local_338;
  undefined4 local_32c;
  Expression *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  CommissionerPool *local_318;
  JobManager *local_310;
  Config *local_308;
  pointer local_300;
  string local_2f8;
  string local_2d8;
  BorderRouter local_2b8;
  Config local_130;
  
  local_32c = (undefined4)CONCAT71(in_register_00000081,aGroupAlias);
  __return_storage_ptr__->mCode = kNone;
  local_338 = (string *)&__return_storage_ptr__->mMessage;
  local_320 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_320;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_328 = aExpr;
  utils::ToLower((string *)&local_2b8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
  if ((BorderAgent *)local_2b8._vptr_BorderRouter != &local_2b8.mAgent) {
    operator_delete(local_2b8._vptr_BorderRouter);
  }
  if (iVar7 != 0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xca,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  if ((long)(local_328->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_328->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xd0,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __k = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_300 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (__k != local_300) {
    local_308 = &this->mDefaultConf;
    local_318 = &this->mCommissionerPool;
    p_Var1 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
    this_00 = local_338;
    local_310 = this;
    do {
      persistent_storage::BorderRouter::BorderRouter(&local_2b8);
      Config::Config(&local_130,local_308);
      PrepareDtlsConfig((Error *)local_380,this,*__k,&local_130);
      __return_storage_ptr__->mCode = local_380._0_4_;
      std::__cxx11::string::operator=(this_00,(string *)&local_378);
      if (local_378._M_p != local_370 + 8) {
        operator_delete(local_378._M_p);
      }
      if (__return_storage_ptr__->mCode == kNone) {
        p_Var10 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_00155d18:
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          CommissionerAppCreate
                    ((Error *)local_380,(shared_ptr<ot::commissioner::CommissionerApp> *)&local_358,
                     &local_130);
          __return_storage_ptr__->mCode = local_380._0_4_;
          std::__cxx11::string::operator=(this_00,(string *)&local_378);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_378._M_p != local_370 + 8) {
            operator_delete(local_378._M_p);
          }
          p_Var12 = &p_Var1->_M_header;
          if (EVar2 == kNone) {
            pmVar8 = std::
                     map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                     ::operator[](local_318,__k);
            (pmVar8->
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr = (element_type *)
                     local_358.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar8->
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_358.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            p_Var10 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            if (p_Var10 != (_Base_ptr)0x0) {
              uVar5 = *__k;
              p_Var9 = &p_Var1->_M_header;
              do {
                if (*(ulong *)(p_Var10 + 1) >= uVar5) {
                  p_Var9 = p_Var10;
                }
                p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar5];
              } while (p_Var10 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
                 (p_Var12 = p_Var9, uVar5 < ((_Rb_tree_header *)p_Var9)->_M_node_count)) {
                p_Var12 = &p_Var1->_M_header;
              }
            }
          }
          if (local_358.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_358.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (EVar2 != kNone) goto LAB_00156026;
        }
        else {
          uVar5 = *__k;
          p_Var12 = &p_Var1->_M_header;
          do {
            if (*(ulong *)(p_Var10 + 1) >= uVar5) {
              p_Var12 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar5];
          } while (p_Var10 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var12 == p_Var1) ||
             (uVar5 < ((_Rb_tree_header *)p_Var12)->_M_node_count)) goto LAB_00155d18;
        }
        cVar6 = (**(code **)(**(long **)((long)p_Var12 + 0x28) + 0x78))();
        if (cVar6 == '\0') {
          MakeBorderRouterChoice((Error *)local_380,this,*__k,&local_2b8);
          __return_storage_ptr__->mCode = local_380._0_4_;
          std::__cxx11::string::operator=(this_00,(string *)&local_378);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_378._M_p != local_370 + 8) {
            operator_delete(local_378._M_p);
          }
          if (EVar2 != kNone) {
LAB_00156026:
            Config::~Config(&local_130);
            local_2b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00288f00;
            BorderAgent::~BorderAgent(&local_2b8.mAgent);
            return __return_storage_ptr__;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_358,local_328);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_358,&local_2b8.mAgent.mAddr);
          __len = 1;
          __val = (uint)local_2b8.mAgent.mPort;
          if (((9 < local_2b8.mAgent.mPort) && (__len = 2, 99 < local_2b8.mAgent.mPort)) &&
             (__len = 3, 999 < local_2b8.mAgent.mPort)) {
            __len = 5 - (__val < 10000);
          }
          local_380 = (undefined1  [8])local_370;
          std::__cxx11::string::_M_construct((ulong)local_380,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_380,__len,__val);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_358
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380
                    );
          this = local_310;
          this_00 = local_338;
          if (local_380 != (undefined1  [8])local_370) {
            operator_delete((void *)local_380);
          }
          if ((long)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x60) {
            __assert_fail("condition",
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                          ,0xf7,
                          "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                         );
          }
          CreateJob((Error *)local_380,this,(CommissionerAppPtr *)((long)p_Var12 + 0x28),&local_358,
                    *__k);
          __return_storage_ptr__->mCode = local_380._0_4_;
          std::__cxx11::string::operator=(this_00,(string *)&local_378);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_378._M_p != local_370 + 8) {
            operator_delete(local_378._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_358);
          if (EVar2 != kNone) goto LAB_00156026;
        }
        else if ((char)local_32c == '\0') {
          uVar3 = *__k;
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"already started","")
          ;
          InfoMsg(this,uVar3,&local_2f8);
          _Var11._M_p = local_2f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) goto LAB_00155cda;
        }
      }
      else {
        uVar3 = *__k;
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        pcVar4 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,pcVar4,
                   pcVar4 + (__return_storage_ptr__->mMessage)._M_string_length);
        ErrorMsg(this,uVar3,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        local_380 = (undefined1  [8])((ulong)local_380 & 0xffffffff00000000);
        local_370._0_8_ = 0;
        local_370[8] = '\0';
        __return_storage_ptr__->mCode = kNone;
        local_378._M_p = (pointer)(local_370 + 8);
        std::__cxx11::string::operator=(this_00,(string *)&local_378);
        _Var11._M_p = local_378._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_370 + 8)) {
LAB_00155cda:
          operator_delete(_Var11._M_p);
        }
      }
      Config::~Config(&local_130);
      local_2b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00288f00;
      BorderAgent::~BorderAgent(&local_2b8.mAgent);
      __k = __k + 1;
    } while (__k != local_300);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareStartJobs(const Interpreter::Expression &aExpr,
                                   const std::vector<uint64_t>   &aNids,
                                   bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "start");
    /*
     * Coming here is a result of using multi-network syntax.
     * Therefore, no extra arguments to be used, otherwise it
     * is multi-network syntax violation.
     */
    ASSERT(aExpr.size() == 1);

    for (const auto &nid : aNids)
    {
        BorderRouter br;
        Config       conf = mDefaultConf;

        error = PrepareDtlsConfig(nid, conf);
        if (error != ERROR_NONE)
        {
            ErrorMsg(nid, error.GetMessage());
            error = ERROR_NONE;
            continue;
        }
        {
            auto entry = mCommissionerPool.find(nid);
            if (entry == mCommissionerPool.end())
            {
                CommissionerAppPtr commissioner;

                SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
                mCommissionerPool[nid] = commissioner;
                entry                  = mCommissionerPool.find(nid);
            }

            bool active = entry->second->IsActive();
            if (active)
            {
                if (!aGroupAlias)
                {
                    InfoMsg(nid, "already started");
                }
                continue;
            }

            SuccessOrExit(error = MakeBorderRouterChoice(nid, br));
            auto expr = aExpr;
            expr.push_back(br.mAgent.mAddr);
            expr.push_back(std::to_string(br.mAgent.mPort));
            ASSERT(expr.size() == 3); // 'start br_addr br_port'
            SuccessOrExit(error = CreateJob(entry->second, expr, nid));
        }
    }
exit:
    return error;
}